

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O2

XVisualInfo *
sf::priv::GlxContext::selectBestVisual
          (XVisualInfo *__return_storage_ptr__,Display *display,uint bitsPerPixel,
          ContextSettings *settings)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  VisualID VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  XVisualInfo *pXVar14;
  ostream *poVar15;
  int iVar16;
  int i;
  long lVar17;
  bool sRgb_00;
  int sRgb;
  int samples;
  int multiSampling;
  uint local_64;
  int stencil;
  int depth;
  int alpha;
  int blue;
  int green;
  int red;
  int doubleBuffer;
  int count;
  XVisualInfo *local_40;
  ContextSettings *local_38;
  
  local_64 = bitsPerPixel;
  local_38 = settings;
  anon_unknown.dwarf_4e60c1::ensureExtensionsInit(display,*(int *)(display + 0xe0));
  iVar1 = *(int *)(display + 0xe0);
  pXVar14 = (XVisualInfo *)XGetVisualInfo(display,0,0,&count);
  if (pXVar14 == (XVisualInfo *)0x0) {
    poVar15 = err();
    poVar15 = std::operator<<(poVar15,"No GLX visual found. You should check your graphics driver");
    std::endl<char,std::char_traits<char>>(poVar15);
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
  }
  else {
    __return_storage_ptr__->blue_mask = 0;
    __return_storage_ptr__->colormap_size = 0;
    __return_storage_ptr__->bits_per_rgb = 0;
    __return_storage_ptr__->red_mask = 0;
    __return_storage_ptr__->green_mask = 0;
    __return_storage_ptr__->screen = 0;
    __return_storage_ptr__->depth = 0;
    *(undefined8 *)&__return_storage_ptr__->c_class = 0;
    __return_storage_ptr__->visual = (Visual *)0x0;
    __return_storage_ptr__->visualid = 0;
    iVar16 = 0x7fffffff;
    local_40 = pXVar14;
    for (lVar17 = 0; lVar17 < count; lVar17 = lVar17 + 1) {
      if (pXVar14->screen == iVar1) {
        (*sf_glad_glXGetConfig)(display,pXVar14,5,&doubleBuffer);
        if (doubleBuffer != 0) {
          (*sf_glad_glXGetConfig)(display,pXVar14,8,&red);
          (*sf_glad_glXGetConfig)(display,pXVar14,9,&green);
          (*sf_glad_glXGetConfig)(display,pXVar14,10,&blue);
          (*sf_glad_glXGetConfig)(display,pXVar14,0xb,&alpha);
          (*sf_glad_glXGetConfig)(display,pXVar14,0xc,&depth);
          (*sf_glad_glXGetConfig)(display,pXVar14,0xd,&stencil);
          if (SF_GLAD_GLX_ARB_multisample == 0) {
            multiSampling = 0;
            samples = 0;
          }
          else {
            (*sf_glad_glXGetConfig)(display,pXVar14,100000,&multiSampling);
            (*sf_glad_glXGetConfig)(display,pXVar14,0x186a1,&samples);
          }
          if (SF_GLAD_GLX_ARB_framebuffer_sRGB == 0 && SF_GLAD_GLX_EXT_framebuffer_sRGB == 0) {
            sRgb = 0;
            sRgb_00 = false;
          }
          else {
            (*sf_glad_glXGetConfig)(display,pXVar14,0x20b2,&sRgb);
            sRgb_00 = sRgb == 1;
          }
          iVar13 = multiSampling;
          if (multiSampling != 0) {
            iVar13 = samples;
          }
          iVar13 = GlContext::evaluateFormat
                             (local_64,local_38,green + red + blue + alpha,depth,stencil,iVar13,true
                              ,sRgb_00);
          if (iVar13 < iVar16) {
            uVar2 = *(undefined4 *)&pXVar14->visual;
            uVar3 = *(undefined4 *)((long)&pXVar14->visual + 4);
            VVar7 = pXVar14->visualid;
            uVar4 = *(undefined4 *)((long)&pXVar14->visualid + 4);
            iVar9 = pXVar14->screen;
            iVar10 = pXVar14->depth;
            iVar11 = pXVar14->c_class;
            uVar12 = *(undefined4 *)&pXVar14->field_0x1c;
            uVar5 = pXVar14->red_mask;
            uVar6 = pXVar14->green_mask;
            iVar16 = pXVar14->colormap_size;
            iVar8 = pXVar14->bits_per_rgb;
            __return_storage_ptr__->blue_mask = pXVar14->blue_mask;
            __return_storage_ptr__->colormap_size = iVar16;
            __return_storage_ptr__->bits_per_rgb = iVar8;
            __return_storage_ptr__->red_mask = uVar5;
            __return_storage_ptr__->green_mask = uVar6;
            __return_storage_ptr__->screen = iVar9;
            __return_storage_ptr__->depth = iVar10;
            __return_storage_ptr__->c_class = iVar11;
            *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar12;
            *(undefined4 *)&__return_storage_ptr__->visual = uVar2;
            *(undefined4 *)((long)&__return_storage_ptr__->visual + 4) = uVar3;
            *(int *)&__return_storage_ptr__->visualid = (int)VVar7;
            *(undefined4 *)((long)&__return_storage_ptr__->visualid + 4) = uVar4;
            iVar16 = iVar13;
          }
        }
      }
      pXVar14 = pXVar14 + 1;
    }
    XFree(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

XVisualInfo GlxContext::selectBestVisual(::Display* display, unsigned int bitsPerPixel, const ContextSettings& settings)
{
    // Make sure that extensions are initialized
    ensureExtensionsInit(display, DefaultScreen(display));

    const int screen = DefaultScreen(display);

    // Retrieve all the visuals
    int count;
    XVisualInfo* visuals = XGetVisualInfo(display, 0, NULL, &count);
    if (visuals)
    {
        // Evaluate all the returned visuals, and pick the best one
        int bestScore = 0x7FFFFFFF;
        XVisualInfo bestVisual = XVisualInfo();
        for (int i = 0; i < count; ++i)
        {
            // Filter by screen
            if (visuals[i].screen != screen)
                continue;

            // Check mandatory attributes
            int doubleBuffer;
            glXGetConfig(display, &visuals[i], GLX_DOUBLEBUFFER, &doubleBuffer);
            if (!doubleBuffer)
                continue;

            // Extract the components of the current visual
            int red, green, blue, alpha, depth, stencil, multiSampling, samples, sRgb;
            glXGetConfig(display, &visuals[i], GLX_RED_SIZE,     &red);
            glXGetConfig(display, &visuals[i], GLX_GREEN_SIZE,   &green);
            glXGetConfig(display, &visuals[i], GLX_BLUE_SIZE,    &blue);
            glXGetConfig(display, &visuals[i], GLX_ALPHA_SIZE,   &alpha);
            glXGetConfig(display, &visuals[i], GLX_DEPTH_SIZE,   &depth);
            glXGetConfig(display, &visuals[i], GLX_STENCIL_SIZE, &stencil);

            if (SF_GLAD_GLX_ARB_multisample)
            {
                glXGetConfig(display, &visuals[i], GLX_SAMPLE_BUFFERS_ARB, &multiSampling);
                glXGetConfig(display, &visuals[i], GLX_SAMPLES_ARB,        &samples);
            }
            else
            {
                multiSampling = 0;
                samples = 0;
            }

            if (SF_GLAD_GLX_EXT_framebuffer_sRGB || SF_GLAD_GLX_ARB_framebuffer_sRGB)
            {
                glXGetConfig(display, &visuals[i], GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &sRgb);
            }
            else
            {
                sRgb = 0;
            }

            // TODO: Replace this with proper acceleration detection
            bool accelerated = true;

            // Evaluate the visual
            int color = red + green + blue + alpha;
            int score = evaluateFormat(bitsPerPixel, settings, color, depth, stencil, multiSampling ? samples : 0, accelerated, sRgb == True);

            // If it's better than the current best, make it the new best
            if (score < bestScore)
            {
                bestScore = score;
                bestVisual = visuals[i];
            }
        }

        // Free the array of visuals
        XFree(visuals);

        return bestVisual;
    }
    else
    {
        // Should never happen...
        err() << "No GLX visual found. You should check your graphics driver" << std::endl;

        return XVisualInfo();
    }
}